

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_array_union.hh
# Opt level: O0

void avro::codec_traits<uau::_union_array_union_Union__0__>::encode
               (Encoder *e,_union_array_union_Union__0__ *v)

{
  size_t sVar1;
  _union_array_union_Union__0__ *in_RSI;
  Encoder *in_RDI;
  _union_array_union_Union__0__ *unaff_retaddr;
  int *in_stack_ffffffffffffffb8;
  
  sVar1 = uau::_union_array_union_Union__0__::idx(in_RSI);
  (**(code **)(*(long *)in_RDI + 0xa0))(in_RDI,sVar1);
  sVar1 = uau::_union_array_union_Union__0__::idx(in_RSI);
  if (sVar1 == 0) {
    (**(code **)(*(long *)in_RDI + 0x20))();
  }
  else if (sVar1 == 1) {
    uau::_union_array_union_Union__0__::get_int(unaff_retaddr);
    encode<int>(in_RDI,in_stack_ffffffffffffffb8);
  }
  return;
}

Assistant:

static void encode(Encoder& e, uau::_union_array_union_Union__0__ v) {
        e.encodeUnionIndex(v.idx());
        switch (v.idx()) {
        case 0:
            e.encodeNull();
            break;
        case 1:
            avro::encode(e, v.get_int());
            break;
        }
    }